

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

void share_xchannel_free(share_xchannel *xc)

{
  share_xchannel_message *ptr;
  
  ptr = xc->msghead;
  while (ptr != (share_xchannel_message *)0x0) {
    xc->msghead = ptr->next;
    safefree(ptr);
    ptr = xc->msghead;
  }
  safefree(xc);
  return;
}

Assistant:

static void share_xchannel_free(struct share_xchannel *xc)
{
    while (xc->msghead) {
        struct share_xchannel_message *tmp = xc->msghead;
        xc->msghead = tmp->next;
        sfree(tmp);
    }
    sfree(xc);
}